

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_precompile_own_augment
                 (lysc_ctx *ctx,lysp_node_augment *aug_p,lysp_module *pmod,lysp_ext_instance *ext)

{
  lysc_nodeid *plVar1;
  LY_ERR LVar2;
  lys_module *plVar3;
  long *object;
  lysc_nodeid *nodeid;
  lysc_nodeid *local_40;
  long *local_38;
  
  local_40 = (lysc_nodeid *)0x0;
  LVar2 = lys_precompile_nodeid(ctx->ctx,(aug_p->field_0).node.name,&local_40);
  plVar1 = local_40;
  if (LVar2 == LY_SUCCESS) {
    plVar3 = lys_schema_node_get_module(ctx->ctx,*local_40->prefix,pmod);
    if (plVar3 == (lys_module *)0x0) {
      LVar2 = LY_EINT;
      ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
             ,0x880);
    }
    else {
      LVar2 = LY_SUCCESS;
      if (plVar3 == ctx->cur_mod) {
        object = (long *)calloc(1,0x28);
        if (object == (long *)0x0) {
          LVar2 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_own_augment");
        }
        else {
          local_38 = object;
          LVar2 = ly_set_add(&ctx->augs,object,'\x01',(uint32_t *)0x0);
          if (LVar2 == LY_SUCCESS) {
            *local_38 = (long)plVar1;
            local_40 = (lysc_nodeid *)0x0;
            local_38[1] = (long)pmod;
            local_38[3] = (long)ext;
            local_38[4] = (long)aug_p;
            LVar2 = LY_SUCCESS;
          }
        }
      }
    }
  }
  lysc_nodeid_free(ctx->ctx,local_40);
  return LVar2;
}

Assistant:

static LY_ERR
lys_precompile_own_augment(struct lysc_ctx *ctx, struct lysp_node_augment *aug_p, const struct lysp_module *pmod,
        const struct lysp_ext_instance *ext)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_nodeid *nodeid = NULL;
    struct lysc_augment *aug;
    const struct lys_module *mod;

    /* compile its target, it was already parsed and fully checked (except for the existence of the nodes) */
    ret = lys_precompile_nodeid(ctx->ctx, aug_p->nodeid, &nodeid);
    LY_CHECK_GOTO(ret, cleanup);

    mod = lys_schema_node_get_module(ctx->ctx, nodeid->prefix[0], pmod);
    LY_CHECK_ERR_GOTO(!mod, LOGINT(ctx->ctx); ret = LY_EINT, cleanup);
    if (mod != ctx->cur_mod) {
        /* augment for another module, ignore */
        goto cleanup;
    }

    /* allocate new compiled augment and store it in the set */
    aug = calloc(1, sizeof *aug);
    LY_CHECK_ERR_GOTO(!aug, LOGMEM(ctx->ctx); ret = LY_EMEM, cleanup);
    LY_CHECK_GOTO(ret = ly_set_add(&ctx->augs, aug, 1, NULL), cleanup);

    aug->nodeid = nodeid;
    nodeid = NULL;
    aug->aug_pmod = pmod;
    aug->ext = ext;
    aug->aug_p = aug_p;

cleanup:
    lysc_nodeid_free(ctx->ctx, nodeid);
    return ret;
}